

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialPivLU.h
# Opt level: O0

void __thiscall
Eigen::PartialPivLU<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>
          (PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix)

{
  Index IVar1;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix_00;
  Index local_28;
  Index local_20;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *local_18;
  EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *matrix_local;
  PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *this_local;
  
  local_18 = matrix;
  matrix_local = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
  SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>::SolverBase
            ((SolverBase<Eigen::PartialPivLU<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)this);
  local_20 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  local_28 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols(local_18);
  Matrix<double,-1,-1,0,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,0,_1,_1> *)this,&local_20,&local_28);
  IVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  PermutationMatrix<-1,_-1,_int>::PermutationMatrix
            ((PermutationMatrix<_1,__1,_int> *)(this + 0x18),IVar1);
  IVar1 = EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows(local_18);
  Transpositions<-1,_-1,_int>::Transpositions((Transpositions<_1,__1,_int> *)(this + 0x28),IVar1);
  *(undefined8 *)(this + 0x38) = 0;
  this[0x40] = (PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  this[0x41] = (PartialPivLU<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x0;
  matrix_00 = (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
              EigenBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::derived(local_18);
  compute<Eigen::Matrix<double,_1,_1,0,_1,_1>>(this,matrix_00);
  return;
}

Assistant:

PartialPivLU<MatrixType>::PartialPivLU(const EigenBase<InputType>& matrix)
  : m_lu(matrix.rows(),matrix.cols()),
    m_p(matrix.rows()),
    m_rowsTranspositions(matrix.rows()),
    m_l1_norm(0),
    m_det_p(0),
    m_isInitialized(false)
{
  compute(matrix.derived());
}